

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64_t max_value,uint64_t *output)

{
  char cVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  
  pbVar2 = (byte *)(text->_M_dataplus)._M_p;
  if (*pbVar2 == 0x30) {
    if ((pbVar2[1] | 0x20) == 0x78) {
      pbVar2 = pbVar2 + 2;
      uVar3 = 0x1000000000000000;
      uVar5 = 0x10;
    }
    else {
      uVar3 = 0x2000000000000000;
      uVar5 = 8;
    }
  }
  else {
    uVar3 = 0x199999999999999a;
    uVar5 = 10;
  }
  uVar6 = 0;
  do {
    uVar8 = (ulong)*pbVar2;
    iVar4 = (int)uVar5;
    if (uVar8 == 0) goto LAB_00203c78;
    pbVar2 = pbVar2 + 1;
    cVar1 = (anonymous_namespace)::kAsciiToInt[uVar8];
    uVar9 = (long)cVar1;
    if (uVar8 == 0x30) {
      uVar9 = uVar6;
    }
    if (cVar1 < iVar4) {
      uVar6 = uVar9;
    }
    cVar7 = (uVar8 != 0x30) * '\x03';
    if (iVar4 <= cVar1) {
      cVar7 = '\x01';
    }
  } while (cVar7 == '\0');
  if (cVar7 == '\x03') {
LAB_00203c78:
    do {
      if ((ulong)*pbVar2 == 0) {
        if (max_value < uVar6) {
          return false;
        }
        *output = uVar6;
        return true;
      }
      if (iVar4 <= (char)(anonymous_namespace)::kAsciiToInt[*pbVar2]) {
        return false;
      }
      if (uVar3 <= uVar6) {
        return false;
      }
      uVar6 = uVar6 * uVar5 + (ulong)(uint)(int)(char)(anonymous_namespace)::kAsciiToInt[*pbVar2];
      pbVar2 = pbVar2 + 1;
    } while (uVar5 <= uVar6);
  }
  return false;
}

Assistant:

Tokenizer::Tokenizer(ZeroCopyInputStream* input,
                     ErrorCollector* error_collector)
    : input_(input),
      error_collector_(error_collector),
      buffer_(nullptr),
      buffer_size_(0),
      buffer_pos_(0),
      read_error_(false),
      line_(0),
      column_(0),
      record_target_(nullptr),
      record_start_(-1),
      allow_f_after_float_(false),
      comment_style_(CPP_COMMENT_STYLE),
      require_space_after_number_(true),
      allow_multiline_strings_(false) {
  current_.line = 0;
  current_.column = 0;
  current_.end_column = 0;
  current_.type = TYPE_START;
  previous_ = current_;

  Refresh();
}